

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O1

int av1_cyclic_refresh_estimate_bits_at_q(AV1_COMP *cpi,double correction_factor)

{
  CYCLIC_REFRESH *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  iVar4 = (cpi->common).quant_params.base_qindex;
  pCVar1 = cpi->cyclic_refresh;
  dVar5 = (double)((cpi->common).mi_params.MBs << 4);
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    iVar2 = pCVar1->actual_num_seg1_blocks;
    dVar6 = (double)pCVar1->actual_num_seg2_blocks / dVar5;
  }
  else {
    iVar2 = ((cpi->common).mi_params.mi_rows * pCVar1->percent_refresh *
            (cpi->common).mi_params.mi_cols) / 100;
    dVar6 = 0.0;
  }
  dVar5 = (double)iVar2 / dVar5;
  iVar2 = av1_estimate_bits_at_q(cpi,iVar4,correction_factor);
  iVar3 = av1_estimate_bits_at_q(cpi,pCVar1->qindex_delta[1] + iVar4,correction_factor);
  iVar4 = av1_estimate_bits_at_q(cpi,iVar4 + pCVar1->qindex_delta[2],correction_factor);
  dVar5 = round((double)iVar4 * dVar6 +
                (double)iVar3 * dVar5 + (double)iVar2 * ((1.0 - dVar5) - dVar6));
  return (int)dVar5;
}

Assistant:

int av1_cyclic_refresh_estimate_bits_at_q(const AV1_COMP *cpi,
                                          double correction_factor) {
  const AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  const CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int mbs = cm->mi_params.MBs;
  const int num4x4bl = mbs << 4;
  // Weight for non-base segments: use actual number of blocks refreshed in
  // previous/just encoded frame. Note number of blocks here is in 4x4 units.
  double weight_segment1 = (double)cr->actual_num_seg1_blocks / num4x4bl;
  double weight_segment2 = (double)cr->actual_num_seg2_blocks / num4x4bl;
  if (cpi->rc.rtc_external_ratectrl) {
    weight_segment1 = (double)(cr->percent_refresh * cm->mi_params.mi_rows *
                               cm->mi_params.mi_cols / 100) /
                      num4x4bl;
    weight_segment2 = 0;
  }
  // Take segment weighted average for estimated bits.
  const int estimated_bits = (int)round(
      (1.0 - weight_segment1 - weight_segment2) *
          av1_estimate_bits_at_q(cpi, base_qindex, correction_factor) +
      weight_segment1 *
          av1_estimate_bits_at_q(cpi, base_qindex + cr->qindex_delta[1],
                                 correction_factor) +
      weight_segment2 *
          av1_estimate_bits_at_q(cpi, base_qindex + cr->qindex_delta[2],
                                 correction_factor));
  return estimated_bits;
}